

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

__pid_t __thiscall subprocess::Popen::wait(Popen *this,void *__stat_loc)

{
  __pid_t __pid;
  int iVar1;
  uint uVar2;
  int *piVar3;
  OSError *this_00;
  uint uVar4;
  long in_FS_OFFSET;
  allocator<char> local_41;
  int status;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __pid = this->child_pid_;
  status = 0;
  do {
    iVar1 = waitpid(__pid,&status,0);
  } while (iVar1 == 0);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    uVar2 = 0;
    if (*piVar3 != 10) {
      this_00 = (OSError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&status,"waitpid failed",&local_41);
      OSError::OSError(this_00,(string *)&status,*piVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(this_00,&OSError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0036069e;
    }
  }
  else {
    uVar4 = status & 0x7f;
    if (uVar4 == 0) {
      uVar2 = (uint)status >> 8 & 0xff;
    }
    else {
      uVar2 = 0xff;
      if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        uVar2 = uVar4;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar2;
  }
LAB_0036069e:
  __stack_chk_fail();
}

Assistant:

inline int Popen::wait() noexcept(false)
{
#ifdef __USING_WINDOWS__
  int ret = WaitForSingleObject(process_handle_, INFINITE);

  return 0;
#else
  int ret, status;
  std::tie(ret, status) = util::wait_for_child_exit(child_pid_);
  if (ret == -1) {
    if (errno != ECHILD) throw OSError("waitpid failed", errno);
    return 0;
  }
  if (WIFEXITED(status)) return WEXITSTATUS(status);
  if (WIFSIGNALED(status)) return WTERMSIG(status);
  else return 255;

  return 0;
#endif
}